

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::Release
          (RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *this)

{
  RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *this_local;
  
  if (this->m_pObject != (ShaderResourceBindingVkImpl *)0x0) {
    RefCountedObject<Diligent::IShaderResourceBindingVk>::Release
              ((RefCountedObject<Diligent::IShaderResourceBindingVk> *)this->m_pObject);
    this->m_pObject = (ShaderResourceBindingVkImpl *)0x0;
  }
  return;
}

Assistant:

void Release() noexcept
    {
        if (m_pObject)
        {
            m_pObject->Release();
            m_pObject = nullptr;
        }
    }